

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5Iter * fts5MultiIterAlloc(Fts5Index *p,int nSeg)

{
  long lVar1;
  Fts5Iter *pFVar2;
  long lVar3;
  
  lVar1 = 2;
  do {
    lVar3 = lVar1;
    lVar1 = lVar3 * 2;
  } while (lVar3 < nSeg);
  pFVar2 = (Fts5Iter *)sqlite3Fts5MallocZero(&p->rc,lVar3 * 0x84 + 0x68);
  if (pFVar2 != (Fts5Iter *)0x0) {
    pFVar2->nSeg = (int)lVar3;
    pFVar2->aFirst = (Fts5CResult *)(pFVar2->aSeg + lVar3);
    pFVar2->pIndex = p;
    pFVar2->xSetOutputs = fts5IterSetOutputs_Noop;
  }
  return pFVar2;
}

Assistant:

static Fts5Iter *fts5MultiIterAlloc(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  int nSeg
){
  Fts5Iter *pNew;
  i64 nSlot;                      /* Power of two >= nSeg */

  for(nSlot=2; nSlot<nSeg; nSlot=nSlot*2);
  pNew = fts5IdxMalloc(p,
      sizeof(Fts5Iter) +                  /* pNew */
      sizeof(Fts5SegIter) * (nSlot-1) +   /* pNew->aSeg[] */
      sizeof(Fts5CResult) * nSlot         /* pNew->aFirst[] */
  );
  if( pNew ){
    pNew->nSeg = nSlot;
    pNew->aFirst = (Fts5CResult*)&pNew->aSeg[nSlot];
    pNew->pIndex = p;
    pNew->xSetOutputs = fts5IterSetOutputs_Noop;
  }
  return pNew;
}